

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodFactory.hpp
# Opt level: O3

unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> __thiscall
OpenMD::RNEMD::MethodFactory::create(MethodFactory *this,SimInfo *info,ForceManager *forceMan)

{
  int iVar1;
  SPFMethod *this_00;
  ForceManager *in_RCX;
  
  iVar1 = std::__cxx11::basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>::
          compare((basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_> *)info,
                  "Swap");
  if (iVar1 == 0) {
    this_00 = (SPFMethod *)operator_new(0x1f88);
    SwapMethod::SwapMethod((SwapMethod *)this_00,(SimInfo *)forceMan,in_RCX);
  }
  else {
    iVar1 = std::__cxx11::basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>::
            compare((basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_> *)info
                    ,"NIVS");
    if (iVar1 == 0) {
      this_00 = (SPFMethod *)operator_new(0x1f88);
      NIVSMethod::NIVSMethod((NIVSMethod *)this_00,(SimInfo *)forceMan,in_RCX);
    }
    else {
      iVar1 = std::__cxx11::basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>
              ::compare((basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_> *)
                        info,"SPF");
      if (iVar1 == 0) {
        this_00 = (SPFMethod *)operator_new(0x28f8);
        SPFMethod::SPFMethod(this_00,(SimInfo *)forceMan,in_RCX);
      }
      else {
        this_00 = (SPFMethod *)operator_new(0x1f88);
        VSSMethod::VSSMethod((VSSMethod *)this_00,(SimInfo *)forceMan,in_RCX);
      }
    }
  }
  (this->methodStr_)._M_dataplus._M_p = (pointer)this_00;
  return (__uniq_ptr_data<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>,_true,_true>
          )(__uniq_ptr_data<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<RNEMD> create(SimInfo* info, ForceManager* forceMan) {
      if (methodStr_ == "Swap")
        return std::make_unique<SwapMethod>(info, forceMan);

      else if (methodStr_ == "NIVS")
        return std::make_unique<NIVSMethod>(info, forceMan);

      else if (methodStr_ == "SPF")
        return std::make_unique<SPFMethod>(info, forceMan);

      else
        return std::make_unique<VSSMethod>(info, forceMan);
    }